

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  type rollback;
  value_type *pvVar2;
  success<toml::detail::region> local_178;
  undefined1 local_130 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt_1;
  undefined1 local_c0 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  size_t i;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  region retval;
  location *loc_local;
  
  region::region((region *)&first,loc);
  rollback = location::iter(loc);
  for (rslt.field_1.succ.value.last_._M_current = (const_iterator)(char *)0x0;
      rslt.field_1.succ.value.last_._M_current == (char *)0x0;
      rslt.field_1.succ.value.last_._M_current =
           (const_iterator)((long)rslt.field_1.succ.value.last_._M_current + 1)) {
    either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_c0,loc);
    bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_c0);
    if (bVar1) {
      location::reset(loc,(const_iterator)rollback._M_current);
      none();
      result<toml::detail::region,_toml::detail::none_t>::result
                (__return_storage_ptr__,
                 (failure_type *)((long)&rslt_1.field_1.succ.value.last_._M_current + 7));
    }
    else {
      pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                         ((result<toml::detail::region,_toml::detail::none_t> *)local_c0);
      region::operator+=((region *)&first,pvVar2);
    }
    rslt_1.field_1._65_3_ = 0;
    rslt_1.field_1._64_1_ = bVar1;
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_c0);
    if (rslt_1.field_1._64_4_ != 0) goto LAB_00141c86;
  }
  do {
    either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_130,loc);
    bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_130);
    if (bVar1) {
      ok<toml::detail::region>(&local_178,(region *)&first);
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_178);
      success<toml::detail::region>::~success(&local_178);
    }
    else {
      pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                         ((result<toml::detail::region,_toml::detail::none_t> *)local_130);
      region::operator+=((region *)&first,pvVar2);
    }
    rslt_1.field_1._65_3_ = 0;
    rslt_1.field_1._64_1_ = bVar1;
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_130);
  } while (rslt_1.field_1._64_4_ == 0);
LAB_00141c86:
  region::~region((region *)&first);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);

        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }